

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::read_content<httplib::Request>(Stream *strm,Request *x,Progress *progress)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  const_iterator cVar5;
  string *out;
  char *__s1;
  pointer pcVar6;
  pointer pcVar7;
  key_type local_80;
  pointer local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  string *local_38;
  
  iVar3 = get_header_value_int(&x->headers,"Content-Length",0);
  if (iVar3 == 0) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Transfer-Encoding","");
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(x->headers)._M_t,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((_Rb_tree_header *)cVar5._M_node == &(x->headers)._M_t._M_impl.super__Rb_tree_header) {
      __s1 = "";
    }
    else {
      __s1 = *(char **)(cVar5._M_node + 2);
    }
    iVar3 = strcasecmp(__s1,"chunked");
    if (iVar3 == 0) {
      bVar2 = read_content_chunked((detail *)strm,(Stream *)&x->body,out);
    }
    else {
      do {
        iVar3 = (*strm->_vptr_Stream[2])(strm,&local_80,1);
        if (iVar3 < 0) {
          cVar5._M_node = (_Base_ptr)0x0;
LAB_0011a055:
          bVar1 = false;
        }
        else {
          if (iVar3 == 0) {
            cVar5._M_node = (_Base_ptr)0x1;
            goto LAB_0011a055;
          }
          std::__cxx11::string::push_back((char)&x->body);
          bVar1 = true;
        }
        bVar2 = (byte)cVar5._M_node;
      } while (bVar1);
    }
  }
  else {
    pcVar7 = (pointer)(long)iVar3;
    std::function<void_(unsigned_long,_unsigned_long)>::function
              ((function<void_(unsigned_long,_unsigned_long)> *)&local_58,progress);
    local_38 = &x->body;
    std::__cxx11::string::_M_replace_aux((ulong)&x->body,0,(x->body)._M_string_length,(char)iVar3);
    pcVar6 = (pointer)0x0;
    do {
      bVar2 = pcVar7 <= pcVar6;
      if (pcVar7 <= pcVar6) break;
      uVar4 = (*strm->_vptr_Stream[2])(strm,pcVar6 + (long)(local_38->_M_dataplus)._M_p);
      if ((0 < (int)uVar4) && (pcVar6 = pcVar6 + uVar4, local_48 != (code *)0x0)) {
        local_80._M_dataplus._M_p = pcVar6;
        local_60 = pcVar7;
        (*local_40)(&local_58,(unsigned_long *)&local_80,(unsigned_long *)&local_60);
      }
    } while (0 < (int)uVar4);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool read_content(Stream& strm, T& x, Progress progress = Progress())
{
    auto len = get_header_value_int(x.headers, "Content-Length", 0);

    if (len) {
        return read_content_with_length(strm, x.body, len, progress);
    } else {
        const auto& encoding = get_header_value(x.headers, "Transfer-Encoding", "");

        if (!strcasecmp(encoding, "chunked")) {
            return read_content_chunked(strm, x.body);
        } else {
            return read_content_without_length(strm, x.body);
        }
    }

    return true;
}